

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElementDecl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLElementDecl::serialize(XMLElementDecl *this,XSerializeEngine *serEng)

{
  bool bVar1;
  CreateReasons local_1c;
  XSerializeEngine *pXStack_18;
  int i;
  XSerializeEngine *serEng_local;
  XMLElementDecl *this_local;
  
  pXStack_18 = serEng;
  serEng_local = (XSerializeEngine *)this;
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    operator<<(pXStack_18,&this->fElementName->super_XSerializable);
    XSerializeEngine::operator<<(pXStack_18,this->fCreateReason);
    XSerializeEngine::writeSize(pXStack_18,this->fId);
    XSerializeEngine::operator<<(pXStack_18,(bool)(this->fExternalElement & 1));
  }
  else {
    xercesc_4_0::operator>>(pXStack_18,&this->fElementName);
    XSerializeEngine::operator>>(pXStack_18,(int *)&local_1c);
    this->fCreateReason = local_1c;
    XSerializeEngine::readSize(pXStack_18,&this->fId);
    XSerializeEngine::operator>>(pXStack_18,&this->fExternalElement);
  }
  return;
}

Assistant:

void XMLElementDecl::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fElementName;
        serEng<<(int) fCreateReason;
        serEng.writeSize (fId);
        serEng<<fExternalElement;
    }
    else
    {
        serEng>>fElementName;

        int i;
        serEng>>i;
        fCreateReason=(CreateReasons)i;

        serEng.readSize (fId);
        serEng>>fExternalElement;
    }

}